

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRVersion.cpp
# Opt level: O1

Version * ZXing::QRCode::Version::Model1(int number)

{
  int iVar1;
  Version *pVVar2;
  long lVar3;
  int *piVar4;
  array<ZXing::QRCode::ECBlocks,_4UL> *paVar5;
  byte bVar6;
  array<ZXing::QRCode::ECBlocks,_4UL> local_480;
  array<ZXing::QRCode::ECBlocks,_4UL> local_430;
  array<ZXing::QRCode::ECBlocks,_4UL> local_3e0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_390;
  array<ZXing::QRCode::ECBlocks,_4UL> local_340;
  array<ZXing::QRCode::ECBlocks,_4UL> local_2f0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_2a0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_250;
  array<ZXing::QRCode::ECBlocks,_4UL> local_200;
  array<ZXing::QRCode::ECBlocks,_4UL> local_1b0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_160;
  array<ZXing::QRCode::ECBlocks,_4UL> local_110;
  array<ZXing::QRCode::ECBlocks,_4UL> local_c0;
  array<ZXing::QRCode::ECBlocks,_4UL> local_70;
  
  bVar6 = 0;
  if (Model1(int)::allVersions == '\0') {
    iVar1 = __cxa_guard_acquire(&Model1(int)::allVersions);
    if (iVar1 != 0) {
      piVar4 = &DAT_001a1b9c;
      paVar5 = &local_70;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions,1,&local_70);
      piVar4 = &DAT_001a1bec;
      paVar5 = &local_c0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 1,2,&local_c0);
      piVar4 = &DAT_001a1c3c;
      paVar5 = &local_110;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 2,3,&local_110);
      piVar4 = &DAT_001a1c8c;
      paVar5 = &local_160;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 3,4,&local_160);
      piVar4 = &DAT_001a1cdc;
      paVar5 = &local_1b0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 4,5,&local_1b0);
      piVar4 = &DAT_001a1d2c;
      paVar5 = &local_200;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 5,6,&local_200);
      piVar4 = &DAT_001a1d7c;
      paVar5 = &local_250;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 6,7,&local_250);
      piVar4 = &DAT_001a1dcc;
      paVar5 = &local_2a0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 7,8,&local_2a0);
      piVar4 = &DAT_001a1e1c;
      paVar5 = &local_2f0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 8,9,&local_2f0);
      piVar4 = &DAT_001a1e6c;
      paVar5 = &local_340;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 9,10,&local_340);
      piVar4 = &DAT_001a1ebc;
      paVar5 = &local_390;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 10,0xb,&local_390);
      piVar4 = &DAT_001a1f0c;
      paVar5 = &local_3e0;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 0xb,0xc,&local_3e0);
      piVar4 = &DAT_001a1f5c;
      paVar5 = &local_430;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 0xc,0xd,&local_430);
      piVar4 = &DAT_001a1fac;
      paVar5 = &local_480;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar5->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        paVar5 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar5 + (ulong)bVar6 * -8 + 4);
      }
      Version(Model1::allVersions + 0xd,0xe,&local_480);
      __cxa_atexit(__cxx_global_array_dtor_112,0,&__dso_handle);
      __cxa_guard_release(&Model1(int)::allVersions);
    }
  }
  pVVar2 = (Version *)0x0;
  if (0xfffffff1 < number - 0xfU) {
    pVVar2 = (Version *)
             &rMQR::allVersions[(ulong)(uint)number + 0x1f]._alignmentPatternCenters.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  return pVVar2;
}

Assistant:

const Version* Version::Model1(int number)
{
	/**
	 * See ISO 18004:2000 M.4.2 Table M.2
	 * See ISO 18004:2000 M.5 Table M.4
	 */
	static const Version allVersions[] = {
		{1, {
			7 , 1, 19, 0, 0,
			10, 1, 16, 0, 0,
			13, 1, 13, 0, 0,
			17, 1, 9 , 0, 0
			}},
		{2, {
			10, 1, 36, 0, 0,
			16, 1, 30, 0, 0,
			22, 1, 24, 0, 0,
			30, 1, 16, 0, 0,
			}},
		{3, {
			15, 1, 57, 0, 0,
			28, 1, 44, 0, 0,
			36, 1, 36, 0, 0,
			48, 1, 24, 0, 0,
			}},
		{4, {
			20, 1, 80, 0, 0,
			40, 1, 60, 0, 0,
			50, 1, 50, 0, 0,
			66, 1, 34, 0, 0,
			}},
		{5, {
			26, 1, 108, 0, 0,
			52, 1, 82 , 0, 0,
			66, 1, 68 , 0, 0,
			44, 2, 23 , 0, 0,
			}},
		{6, {
			34, 1, 136, 0, 0,
			32, 2, 53 , 0, 0,
			42, 2, 43 , 0, 0,
			56, 2, 29 , 0, 0,
			}},
		{7, {
			42, 1, 170, 0, 0,
			40, 2, 66 , 0, 0,
			52, 2, 54 , 0, 0,
			46, 3, 24 , 0, 0,
			}},
		{8, {
			24, 2, 104, 0, 0,
			48, 2, 80 , 0, 0,
			64, 2, 64 , 0, 0,
			56, 3, 29 , 0, 0,
			}},
		{9, {
			30, 2, 123, 0, 0,
			60, 2, 93 , 0, 0,
			50, 3, 52 , 0, 0,
			68, 3, 34 , 0, 0,
			}},
		{10, {
			34, 2, 145, 0, 0,
			68, 2, 111, 0, 0,
			58, 3, 61 , 0, 0,
			58, 4, 31 , 0, 0,
			}},
		{11, {
			40, 2, 168, 0, 0,
			40, 4, 64 , 0, 0,
			52, 4, 52 , 0, 0,
			54, 5, 29 , 0, 0,
			}},
		{12, {
			46, 2, 192, 0, 0,
			46, 4, 73 , 0, 0,
			58, 4, 61 , 0, 0,
			62, 5, 33 , 0, 0,
			}},
		{13, {
			36, 3, 144, 0, 0,
			52, 4, 83 , 0, 0,
			66, 4, 69 , 0, 0,
			58, 6, 32 , 0, 0,
			}},
		{14, {
			40, 3, 163, 0, 0,
			60, 4, 92 , 0, 0,
			60, 5, 62 , 0, 0,
			66, 6, 35 , 0, 0,
			}},
	};

	if (number < 1 || number > 14)
		return nullptr;
	return allVersions + number - 1;
}